

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int yaml_parser_load_scalar(yaml_parser_t *parser,yaml_event_t *first_event)

{
  yaml_node_t *__dest;
  int iVar1;
  int iVar2;
  yaml_char_t *local_90;
  yaml_char_t *tag;
  undefined4 local_80;
  int index;
  yaml_node_t node;
  yaml_event_t *first_event_local;
  yaml_parser_t *parser_local;
  
  local_90 = (first_event->data).scalar.tag;
  node.end_mark.column = (size_t)first_event;
  if (((long)(parser->document->nodes).top - (long)(parser->document->nodes).start) / 0x60 <
      0x7ffffffe) {
    if ((local_90 == (yaml_char_t *)0x0) || (iVar1 = strcmp((char *)local_90,"!"), iVar1 == 0)) {
      yaml_free(local_90);
      local_90 = yaml_strdup((yaml_char_t *)"tag:yaml.org,2002:str");
      if (local_90 == (yaml_char_t *)0x0) goto LAB_0010710b;
    }
    memset(&local_80,0,0x60);
    local_80 = 1;
    node._0_8_ = local_90;
    node.data._24_8_ = *(undefined8 *)(node.end_mark.column + 0x38);
    node.start_mark.index = *(size_t *)(node.end_mark.column + 0x40);
    node.start_mark.line = *(size_t *)(node.end_mark.column + 0x48);
    node.start_mark.column = *(size_t *)(node.end_mark.column + 0x50);
    node.end_mark.index = *(size_t *)(node.end_mark.column + 0x58);
    node.end_mark.line = *(size_t *)(node.end_mark.column + 0x60);
    node.tag = *(yaml_char_t **)(node.end_mark.column + 0x18);
    node.data.scalar.value = (yaml_char_t *)*(undefined8 *)(node.end_mark.column + 0x20);
    node.data.scalar.length._0_4_ = *(undefined4 *)(node.end_mark.column + 0x30);
    if (((parser->document->nodes).top != (parser->document->nodes).end) ||
       (iVar1 = yaml_stack_extend((void **)parser->document,&(parser->document->nodes).top,
                                  &(parser->document->nodes).end), iVar1 != 0)) {
      __dest = (parser->document->nodes).top;
      (parser->document->nodes).top = __dest + 1;
      memcpy(__dest,&local_80,0x60);
      iVar1 = (int)(((long)(parser->document->nodes).top - (long)(parser->document->nodes).start) /
                   0x60);
      iVar2 = yaml_parser_register_anchor(parser,iVar1,*(yaml_char_t **)(node.end_mark.column + 8));
      if (iVar2 != 0) {
        return iVar1;
      }
      return 0;
    }
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    parser->error = YAML_MEMORY_ERROR;
  }
LAB_0010710b:
  yaml_free(local_90);
  yaml_free(*(void **)(node.end_mark.column + 8));
  yaml_free(*(void **)(node.end_mark.column + 0x18));
  return 0;
}

Assistant:

static int
yaml_parser_load_scalar(yaml_parser_t *parser, yaml_event_t *first_event)
{
    yaml_node_t node;
    int index;
    yaml_char_t *tag = first_event->data.scalar.tag;

    if (!STACK_LIMIT(parser, parser->document->nodes, INT_MAX-1)) goto error;

    if (!tag || strcmp((char *)tag, "!") == 0) {
        yaml_free(tag);
        tag = yaml_strdup((yaml_char_t *)YAML_DEFAULT_SCALAR_TAG);
        if (!tag) goto error;
    }

    SCALAR_NODE_INIT(node, tag, first_event->data.scalar.value,
            first_event->data.scalar.length, first_event->data.scalar.style,
            first_event->start_mark, first_event->end_mark);

    if (!PUSH(parser, parser->document->nodes, node)) goto error;

    index = parser->document->nodes.top - parser->document->nodes.start;

    if (!yaml_parser_register_anchor(parser, index,
                first_event->data.scalar.anchor)) return 0;

    return index;

error:
    yaml_free(tag);
    yaml_free(first_event->data.scalar.anchor);
    yaml_free(first_event->data.scalar.value);
    return 0;
}